

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O0

void test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>
               (int num1,_func_int_char_ptr_ptr_char_ptr *read_f,bool is_ok)

{
  int iVar1;
  mp_type mVar2;
  int64_t iVar3;
  uint64_t uVar4;
  float fVar5;
  double dVar6;
  char local_269;
  int rc;
  char num2;
  char *mp_num_pos2;
  int *piStack_258;
  char code;
  char *mp_num_pos1;
  int i;
  int count;
  char mp_nums [16] [16];
  char *local_138;
  char *pos;
  char *end;
  char str [256];
  int str_cap;
  bool is_ok_local;
  _func_int_char_ptr_ptr_char_ptr *read_f_local;
  int num1_local;
  
  iVar1 = snprintf((char *)&end,0x100,"typed read of ");
  local_138 = str + (long)iVar1 + -8;
  if (num1 < 0) {
    iVar1 = snprintf(local_138,(size_t)(str + (0xf8 - (long)local_138)),"%lld",(long)num1);
  }
  else {
    iVar1 = snprintf(local_138,(size_t)(str + (0xf8 - (long)local_138)),"%llu",(long)num1);
  }
  local_138 = local_138 + iVar1;
  iVar1 = snprintf(local_138,(size_t)(str + (0xf8 - (long)local_138))," into ");
  snprintf(local_138 + iVar1,(size_t)(str + (0xf8 - (long)(local_138 + iVar1))),"int%zu_t",8);
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"%s",&end);
  fprintf(_stdout,"\n");
  mp_num_pos1._4_4_ = 0;
  if (-1 < num1) {
    iVar1 = test_encode_uint_all_sizes((char (*) [16])&i,(long)num1);
    mp_num_pos1._4_4_ = iVar1 + mp_num_pos1._4_4_;
  }
  iVar1 = test_encode_int_all_sizes((char (*) [16])(&i + (long)mp_num_pos1._4_4_ * 4),(long)num1);
  mp_num_pos1._4_4_ = iVar1 + mp_num_pos1._4_4_;
  mp_num_pos1._0_4_ = 0;
  do {
    if (mp_num_pos1._4_4_ <= (int)mp_num_pos1) {
      return;
    }
    piStack_258 = &i + (long)(int)mp_num_pos1 * 4;
    mp_num_pos2._7_1_ = (char)*piStack_258;
    mVar2 = mp_typeof((char)*piStack_258);
    if (mVar2 == MP_INT) {
      iVar3 = mp_decode_int((char **)&stack0xfffffffffffffda8);
      if (iVar3 != num1) {
        fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",
                "mp_decode_int(&mp_num_pos1) == (int64_t)num1","false",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x727,"test_read_num");
        exit(-1);
      }
    }
    else {
      mVar2 = mp_typeof((char)*piStack_258);
      if (mVar2 == MP_UINT) {
        uVar4 = mp_decode_uint((char **)&stack0xfffffffffffffda8);
        if (uVar4 != (long)num1) {
          fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",
                  "mp_decode_uint(&mp_num_pos1) == (uint64_t)num1","false",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                  ,0x72a,"test_read_num");
          exit(-1);
        }
      }
      else {
        mVar2 = mp_typeof((char)*piStack_258);
        if (mVar2 == MP_FLOAT) {
          fVar5 = mp_decode_float((char **)&stack0xfffffffffffffda8);
          if ((fVar5 != (float)num1) || (NAN(fVar5) || NAN((float)num1))) {
            fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",
                    "mp_decode_float(&mp_num_pos1) == (float)num1","false",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                    ,0x72d,"test_read_num");
            exit(-1);
          }
        }
        else {
          dVar6 = mp_decode_double((char **)&stack0xfffffffffffffda8);
          if ((dVar6 != (double)num1) || (NAN(dVar6) || NAN((double)num1))) {
            fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",
                    "mp_decode_double(&mp_num_pos1) == (double)num1","false",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                    ,0x730,"test_read_num");
            exit(-1);
          }
        }
      }
    }
    _rc = &i + (long)(int)mp_num_pos1 * 4;
    local_269 = '\0';
    iVar1 = (*read_f)((char **)&rc,&local_269);
    if (is_ok) {
      _ok((uint)(iVar1 == 0),"rc == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73b,"check success for code 0x%02X",(ulong)(uint)(int)mp_num_pos2._7_1_);
      _ok((uint)(piStack_258 == _rc),"mp_num_pos1 == mp_num_pos2",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73c,"check position");
      if (num1 < 0) {
        if (-1 < local_269) {
          fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n","num2 < 0","false",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                  ,0x745,"test_read_num");
          exit(-1);
        }
        _ok((uint)((long)num1 == (long)local_269),"(int64_t)num1 == (int64_t)num2",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x746,"check int number");
      }
      else {
        if (local_269 < '\0') {
          fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n","num2 >= 0","false"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                  ,0x742,"test_read_num");
          exit(-1);
        }
        _ok((uint)((long)num1 == (long)local_269),"(uint64_t)num1 == (uint64_t)num2",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x743,"check int number");
      }
    }
    else {
      _ok((uint)(iVar1 == -1),"rc == -1",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x737,"check failure for code 0x%02X",(ulong)(uint)(int)mp_num_pos2._7_1_);
      _ok((uint)(_rc == &i + (long)(int)mp_num_pos1 * 4),"mp_num_pos2 == mp_nums[i]",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x738,"check position");
    }
    mp_num_pos1._0_4_ = (int)mp_num_pos1 + 1;
  } while( true );
}

Assistant:

static void
test_read_num(ValueT num1, ReadF read_f, bool is_ok)
{
	/*
	 * Build the header message.
	 */
	const int str_cap = 256;
	char str[str_cap];
	char *end = str + str_cap;
	char *pos = str + snprintf(str, str_cap, "typed read of ");
	if (std::is_same<ValueT, float>::value)
		pos += snprintf(pos, end - pos, "%f", (float)num1);
	else if (std::is_same<ValueT, double>::value)
		pos += snprintf(pos, end - pos, "%lf", (double)num1);
	else if (num1 >= 0)
		pos += snprintf(pos, end - pos, "%llu", (long long)num1);
	else
		pos += snprintf(pos, end - pos, "%lld", (long long)num1);
	pos += snprintf(pos, end - pos, " into ");

	static_assert(!std::is_same<TargetT, float>::value,
		      "no float reading");
	if (std::is_integral<TargetT>::value) {
		pos += snprintf(pos, end - pos, "int%zu_t",
				sizeof(TargetT) * 8);
	} else {
		pos += snprintf(pos, end - pos, "double");
	}
	note("%s", str);
	/*
	 * Perform the actual tests.
	 */
	char mp_nums[MP_NUMBER_CODEC_COUNT][MP_NUMBER_MAX_LEN];
	int count = 0;
	if (std::is_integral<ValueT>::value) {
		if (num1 >= 0) {
			count += test_encode_uint_all_sizes(
				&mp_nums[count], num1);
		}
		if (num1 <= INT64_MAX) {
			count += test_encode_int_all_sizes(
				&mp_nums[count], num1);
		}
	} else if (!std::is_integral<TargetT>::value || !is_ok) {
		/*
		 * Only encode floating point types when
		 * 1) expect to also decode them back successfully.
		 * 2) want to fail to decode an integer.
		 *
		 * Encoding integers as floats for decoding them back into
		 * integers won't work.
		 */
		if (std::is_same<ValueT, float>::value)
			mp_encode_float(mp_nums[count++], (float)num1);
		mp_encode_double(mp_nums[count++], (double)num1);
	}
	for (int i = 0; i < count; ++i) {
		const char *mp_num_pos1 = mp_nums[i];
		char code = *mp_num_pos1;
		/* Sanity check of the test encoding. */
		if (mp_typeof(*mp_num_pos1) == MP_INT) {
			fail_unless(mp_decode_int(&mp_num_pos1) ==
				    (int64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_UINT) {
			fail_unless(mp_decode_uint(&mp_num_pos1) ==
				    (uint64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_FLOAT) {
			fail_unless(mp_decode_float(&mp_num_pos1) ==
				    (float)num1);
		} else {
			fail_unless(mp_decode_double(&mp_num_pos1) ==
				    (double)num1);
		}

		const char *mp_num_pos2 = mp_nums[i];
		TargetT num2 = 0;
		int rc = read_f(&mp_num_pos2, &num2);
		if (!is_ok) {
			is(rc, -1, "check failure for code 0x%02X", code);
			is(mp_num_pos2, mp_nums[i], "check position");
			continue;
		}
		is(rc, 0, "check success for code 0x%02X", code);
		is(mp_num_pos1, mp_num_pos2, "check position");
		if (!std::is_integral<TargetT>::value) {
			ok(double_eq(num1, num2), "check float number");
			continue;
		}
		if (num1 >= 0) {
			fail_unless(num2 >= 0);
			is((uint64_t)num1, (uint64_t)num2, "check int number");
		} else {
			fail_unless(num2 < 0);
			is((int64_t)num1, (int64_t)num2, "check int number");
		}
	}
}